

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O2

char * GetHIDCountryName(U8 countryCode)

{
  if (countryCode < 0x24) {
    return &DAT_0013bd80 + *(int *)(&DAT_0013bd80 + (ulong)countryCode * 4);
  }
  return "Reserved";
}

Assistant:

const char* GetHIDCountryName( U8 countryCode )
{
    const char* CountryNames[] = { "Not Supported",
                                   "Arabic",
                                   "Belgian",
                                   "Canadian-Bilingual",
                                   "Canadian-French",
                                   "Czech Republic",
                                   "Danish",
                                   "Finnish",
                                   "French",
                                   "German",
                                   "Greek",
                                   "Hebrew",
                                   "Hungary",
                                   "International (ISO)",
                                   "Italian",
                                   "Japan (Katakana)",
                                   "Korean",
                                   "Latin American",
                                   "Netherlands/Dutch",
                                   "Norwegian",
                                   "Persian (Farsi)",
                                   "Poland",
                                   "Portuguese",
                                   "Russia",
                                   "Slovakia",
                                   "Spanish",
                                   "Swedish",
                                   "Swiss/French",
                                   "Swiss/German",
                                   "Switzerland",
                                   "Taiwan",
                                   "Turkish-Q",
                                   "UK",
                                   "US",
                                   "Yugoslavia",
                                   "Turkish-F" };

    if( countryCode < sizeof( CountryNames ) / sizeof( *CountryNames ) )
        return CountryNames[ countryCode ];

    return "Reserved";
}